

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O0

void debug_lock_free(void *lock_,uint locktype)

{
  debug_lock *lock;
  uint locktype_local;
  void *lock__local;
  
  if (*(int *)((long)lock_ + 0x10) != 0) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
               ,0xdc,"lock->count == 0","debug_lock_free");
  }
  if (locktype != *(uint *)((long)lock_ + 4)) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
               ,0xdd,"locktype == lock->locktype","debug_lock_free");
  }
  if (*lock_ != -0x214f4ef4) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
               ,0xde,"DEBUG_LOCK_SIG == lock->signature","debug_lock_free");
  }
  if (original_lock_fns_.free != (_func_void_void_ptr_uint *)0x0) {
    (*original_lock_fns_.free)(*(void **)((long)lock_ + 0x18),*(uint *)((long)lock_ + 4) | 1);
  }
  *(undefined8 *)((long)lock_ + 0x18) = 0;
  *(undefined4 *)((long)lock_ + 0x10) = 0xffffff9c;
  *(undefined4 *)lock_ = 0x12300fda;
  event_mm_free_(lock_);
  return;
}

Assistant:

static void
debug_lock_free(void *lock_, unsigned locktype)
{
	struct debug_lock *lock = lock_;
	EVUTIL_ASSERT(lock->count == 0);
	EVUTIL_ASSERT(locktype == lock->locktype);
	EVUTIL_ASSERT(DEBUG_LOCK_SIG == lock->signature);
	if (original_lock_fns_.free) {
		original_lock_fns_.free(lock->lock,
		    lock->locktype|EVTHREAD_LOCKTYPE_RECURSIVE);
	}
	lock->lock = NULL;
	lock->count = -100;
	lock->signature = 0x12300fda;
	mm_free(lock);
}